

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_MappingRef::DeleteMappingChannel(ON_MappingRef *this,int mapping_channel_id)

{
  ON_MappingChannel *pOVar1;
  ON_MappingChannel *pOVar2;
  ON_MappingChannel *mc;
  int mapping_channel_id_local;
  ON_MappingRef *this_local;
  
  pOVar1 = MappingChannel(this,mapping_channel_id);
  if (pOVar1 != (ON_MappingChannel *)0x0) {
    pOVar2 = ON_SimpleArray<ON_MappingChannel>::Array(&this->m_mapping_channels);
    ON_SimpleArray<ON_MappingChannel>::Remove
              (&this->m_mapping_channels,(int)(((long)pOVar1 - (long)pOVar2) / 0x98));
  }
  return pOVar1 != (ON_MappingChannel *)0x0;
}

Assistant:

bool ON_MappingRef::DeleteMappingChannel(int mapping_channel_id)
{
  const ON_MappingChannel* mc = MappingChannel(mapping_channel_id);
  if ( mc )
  {
    m_mapping_channels.Remove((int)(mc - m_mapping_channels.Array()));
  }
  return ( 0 != mc);
}